

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_search.c
# Opt level: O1

REF_STATUS ref_search_free(REF_SEARCH ref_search)

{
  if (ref_search != (REF_SEARCH)0x0) {
    if (ref_search->children_ball != (REF_DBL *)0x0) {
      free(ref_search->children_ball);
    }
    if (ref_search->radius != (REF_DBL *)0x0) {
      free(ref_search->radius);
    }
    if (ref_search->pos != (REF_DBL *)0x0) {
      free(ref_search->pos);
    }
    if (ref_search->right != (REF_INT *)0x0) {
      free(ref_search->right);
    }
    if (ref_search->left != (REF_INT *)0x0) {
      free(ref_search->left);
    }
    if (ref_search->item != (REF_INT *)0x0) {
      free(ref_search->item);
    }
    free(ref_search);
    return 0;
  }
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_search_free(REF_SEARCH ref_search) {
  if (NULL == (void *)ref_search) return REF_NULL;
  ref_free(ref_search->children_ball);
  ref_free(ref_search->radius);
  ref_free(ref_search->pos);
  ref_free(ref_search->right);
  ref_free(ref_search->left);
  ref_free(ref_search->item);
  ref_free(ref_search);
  return REF_SUCCESS;
}